

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleShaderRenderCase.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::drawOneIteration
          (MultisampleRenderCase *this)

{
  ostringstream *poVar1;
  RenderContext *pRVar2;
  int iVar3;
  deUint32 dVar4;
  RenderTarget RVar5;
  undefined4 uVar6;
  int iVar7;
  undefined4 extraout_var;
  ShaderProgram *pSVar9;
  ProgramSources *pPVar10;
  TestLog *pTVar11;
  _Base_ptr p_Var12;
  TestError *pTVar13;
  string *description;
  void *__buf;
  long lVar14;
  undefined4 uVar15;
  int sampleNdx_1;
  ulong uVar16;
  int sampleNdx;
  long lVar17;
  Surface resultImage;
  long local_288;
  undefined1 local_280 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  string local_238;
  int local_214;
  ScopedLogSection section;
  string sectionDescription;
  undefined1 local_1d0 [176];
  pointer local_120;
  undefined1 uStack_118;
  undefined7 uStack_117;
  undefined1 uStack_110;
  undefined8 uStack_10f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long lVar8;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar3);
  if (this->m_numIterations < 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sectionDescription,"Test",(allocator<char> *)local_1d0);
  }
  else {
    local_214 = this->m_iteration + 1;
    de::toString<int>(&local_238,&local_214);
    std::operator+(&local_258,"Iteration ",&local_238);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                   &local_258,"/");
    de::toString<int>((string *)&section,&this->m_numIterations);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultImage
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultImage
                   ,": ");
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])
              (&local_50,this,(ulong)(uint)this->m_iteration);
    std::operator+(&sectionDescription,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                   &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)local_1d0);
    std::__cxx11::string::~string((string *)&resultImage);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)local_280);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_238);
  }
  pTVar11 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  de::toString<int>((string *)&resultImage,&this->m_iteration);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                 "Iteration",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultImage);
  description = &sectionDescription;
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar11,(string *)local_1d0,description);
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::string::~string((string *)&resultImage);
  if (this->m_perIterationShader == true) {
    pSVar9 = this->m_program;
    if (pSVar9 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(pSVar9);
    }
    operator_delete(pSVar9,0xd0);
    this->m_program = (ShaderProgram *)0x0;
    pSVar9 = (ShaderProgram *)operator_new(0xd0);
    pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
    memset(local_1d0,0,0xac);
    local_120 = (pointer)0x0;
    uStack_118 = 0;
    uStack_117 = 0;
    uStack_110 = 0;
    uStack_10f = 0;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])
              (&local_258,this,(ulong)(uint)this->m_numTargetSamples);
    glu::VertexSource::VertexSource((VertexSource *)&resultImage,&local_258);
    pPVar10 = glu::ProgramSources::operator<<
                        ((ProgramSources *)local_1d0,(ShaderSource *)&resultImage);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xb])
              (&local_238,this,(ulong)(uint)this->m_numTargetSamples);
    glu::FragmentSource::FragmentSource((FragmentSource *)local_280,&local_238);
    pPVar10 = glu::ProgramSources::operator<<(pPVar10,(ShaderSource *)local_280);
    glu::ShaderProgram::ShaderProgram(pSVar9,pRVar2,pPVar10);
    this->m_program = pSVar9;
    std::__cxx11::string::~string((string *)(local_280 + 8));
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&resultImage.m_pixels);
    std::__cxx11::string::~string((string *)&local_258);
    glu::ProgramSources::~ProgramSources((ProgramSources *)local_1d0);
    pTVar11 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&resultImage,"RenderShader",(allocator<char> *)&local_258);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_280,"Render shader",(allocator<char> *)&local_238);
    tcu::LogSection::LogSection((LogSection *)local_1d0,(string *)&resultImage,(string *)local_280);
    tcu::LogSection::write((LogSection *)local_1d0,(int)pTVar11,__buf,(size_t)description);
    pTVar11 = glu::operator<<(pTVar11,this->m_program);
    tcu::TestLog::endSection(pTVar11);
    tcu::LogSection::~LogSection((LogSection *)local_1d0);
    std::__cxx11::string::~string((string *)local_280);
    std::__cxx11::string::~string((string *)&resultImage);
    if ((this->m_program->m_program).m_info.linkOk == false) {
      pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1d0,"could not build program",(allocator<char> *)&resultImage);
      tcu::TestError::TestError(pTVar13,(string *)local_1d0);
      __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  if (this->m_renderTarget - TARGET_TEXTURE < 2) {
    (**(code **)(lVar8 + 0x78))(0x8d40,this->m_fbo);
    dVar4 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar4,"bind fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x1dc);
    local_1d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1d0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Rendering ");
    std::operator<<((ostream *)poVar1,(string *)&this->m_renderSceneDescription);
    std::operator<<((ostream *)poVar1," with render shader to fbo.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_1d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1d0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Rendering ");
    std::operator<<((ostream *)poVar1,(string *)&this->m_renderSceneDescription);
    std::operator<<((ostream *)poVar1," with render shader to default framebuffer.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1d0 + 8));
  (**(code **)(lVar8 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar8 + 0x188))(0x4000);
  (**(code **)(lVar8 + 0x1a00))(0,0,this->m_renderSize);
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                  ,0x1e6);
  (**(code **)(lVar8 + 0xd8))(this->m_renderVao);
  (**(code **)(lVar8 + 0x40))(0x8892,this->m_buffer);
  for (p_Var12 = (this->m_renderAttribs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var12 != &(this->m_renderAttribs)._M_t._M_impl.super__Rb_tree_header;
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
    iVar3 = (**(code **)(lVar8 + 0x780))
                      ((this->m_program->m_program).m_program,*(undefined8 *)(p_Var12 + 1));
    if (iVar3 != -1) {
      (**(code **)(lVar8 + 0x19f0))(iVar3,4,0x1406,0);
      (**(code **)(lVar8 + 0x610))(iVar3);
    }
  }
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"set attrib",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                  ,0x1f7);
  (**(code **)(lVar8 + 0x1680))((this->m_program->m_program).m_program);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  (**(code **)(lVar8 + 0x538))(this->m_renderMode,0,this->m_renderCount);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
  (**(code **)(lVar8 + 0x1680))(0);
  (**(code **)(lVar8 + 0xd8))(0);
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                  ,0x1ff);
  RVar5 = this->m_renderTarget;
  if (RVar5 - TARGET_TEXTURE < 2) {
    (**(code **)(lVar8 + 0x78))(0x8d40,0);
    RVar5 = this->m_renderTarget;
  }
  if (RVar5 == TARGET_RENDERBUFFER) {
    tcu::Surface::Surface(&resultImage,this->m_renderSize,this->m_renderSize);
    local_1d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1d0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Blitting result from fbo to single sample fbo. (Resolve multisample)");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar8 + 0x78))(0x8ca8,this->m_fbo);
    (**(code **)(lVar8 + 0x78))(0x8ca9,this->m_resolveFbo);
    iVar3 = this->m_renderSize;
    (**(code **)(lVar8 + 0x140))(0,0,iVar3,iVar3,0,0,iVar3,iVar3,0x4000,0x2600);
    dVar4 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar4,"blit resolve",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x21f);
    local_1d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1d0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Reading pixels from single sample framebuffer.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar8 + 0x78))(0x8ca8,this->m_resolveFbo);
    pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_1d0,&resultImage);
    glu::readPixels(pRVar2,0,0,(PixelBufferAccess *)local_1d0);
    dVar4 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar4,"read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x225);
    (**(code **)(lVar8 + 0x78))(0x8d40,0);
    verifyResultImageAndSetResult(this,&resultImage);
  }
  else if (RVar5 == TARGET_TEXTURE) {
    dVar4 = (this->m_textureSamplerProgram->m_program).m_program;
    if (this->m_verifyTextureSampleBuffers != false) {
      uVar6 = (**(code **)(lVar8 + 0x780))(dVar4,"a_position");
      iVar3 = (**(code **)(lVar8 + 0xb48))
                        ((this->m_textureSamplerProgram->m_program).m_program,"u_sampler");
      iVar7 = (**(code **)(lVar8 + 0xb48))
                        ((this->m_textureSamplerProgram->m_program).m_program,"u_sampleNdx");
      uVar15 = 0x9100;
      if (this->m_numRequestedSamples == 0) {
        uVar15 = 0xde1;
      }
      std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::vector
                ((vector<tcu::Surface,_std::allocator<tcu::Surface>_> *)&resultImage,
                 (long)this->m_numTargetSamples,(allocator_type *)local_1d0);
      if (this->m_numRequestedSamples == 0) {
        local_1d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
        std::operator<<((ostream *)(local_1d0 + 8),"Reading texture.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_1d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
        std::operator<<((ostream *)(local_1d0 + 8),"Reading multisample texture sample buffers.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1d0 + 8));
      if (iVar3 == -1) {
        pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1d0,"Location u_sampler was -1.",(allocator<char> *)local_280);
        tcu::TestError::TestError(pTVar13,(string *)local_1d0);
        __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if (iVar7 == -1) {
        pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1d0,"Location u_sampleNdx was -1.",(allocator<char> *)local_280);
        tcu::TestError::TestError(pTVar13,(string *)local_1d0);
        __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      lVar14 = 0;
      for (lVar17 = 0; lVar17 < this->m_numTargetSamples; lVar17 = lVar17 + 1) {
        tcu::Surface::setSize
                  ((Surface *)(resultImage._0_8_ + lVar14),this->m_renderSize,this->m_renderSize);
        lVar14 = lVar14 + 0x18;
      }
      (**(code **)(lVar8 + 0x1c0))(0,0,0,0x3f800000);
      (**(code **)(lVar8 + 0x188))(0x4000);
      (**(code **)(lVar8 + 0x1a00))(0,0,this->m_renderSize);
      dVar4 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar4,"clear",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                      ,0x278);
      (**(code **)(lVar8 + 0xd8))(this->m_resolveVao);
      (**(code **)(lVar8 + 0x40))(0x8892,this->m_resolveBuffer);
      (**(code **)(lVar8 + 0x19f0))(uVar6,4,0x1406,0,0,0);
      (**(code **)(lVar8 + 0x610))(uVar6);
      dVar4 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar4,"set attrib",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                      ,0x27e);
      (**(code **)(lVar8 + 8))(0x84c0);
      (**(code **)(lVar8 + 0xb8))(uVar15,this->m_fboTexture);
      dVar4 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar4,"bind tex",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                      ,0x282);
      (**(code **)(lVar8 + 0x78))(0x8d40,this->m_resolveFbo);
      (**(code **)(lVar8 + 0x1680))((this->m_textureSamplerProgram->m_program).m_program);
      (**(code **)(lVar8 + 0x14f0))(iVar3,0);
      local_1d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1d0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Reading sample buffers");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      local_288 = 0;
      for (uVar16 = 0; (long)uVar16 < (long)this->m_numTargetSamples; uVar16 = uVar16 + 1) {
        (**(code **)(lVar8 + 0x14f0))(iVar7,uVar16 & 0xffffffff);
        (**(code **)(lVar8 + 0x538))(5,0,4);
        dVar4 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar4,"draw",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                        ,0x28e);
        pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
        tcu::Surface::getAccess
                  ((PixelBufferAccess *)local_1d0,(Surface *)(resultImage._0_8_ + local_288));
        glu::readPixels(pRVar2,0,0,(PixelBufferAccess *)local_1d0);
        dVar4 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar4,"read pixels",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                        ,0x291);
        local_288 = local_288 + 0x18;
      }
      (**(code **)(lVar8 + 0x1680))(0);
      (**(code **)(lVar8 + 0xd8))(0);
      (**(code **)(lVar8 + 0x78))(0x8d40,0);
      verifyResultBuffersAndSetResult
                (this,(vector<tcu::Surface,_std::allocator<tcu::Surface>_> *)&resultImage);
      std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::~vector
                ((vector<tcu::Surface,_std::allocator<tcu::Surface>_> *)&resultImage);
      goto LAB_012d2c54;
    }
    uVar6 = (**(code **)(lVar8 + 0x780))(dVar4,"a_position");
    iVar3 = (**(code **)(lVar8 + 0xb48))
                      ((this->m_textureSamplerProgram->m_program).m_program,"u_sampler");
    uVar15 = 0x9100;
    if (this->m_numRequestedSamples == 0) {
      uVar15 = 0xde1;
    }
    tcu::Surface::Surface(&resultImage,this->m_renderSize,this->m_renderSize);
    if (this->m_numRequestedSamples == 0) {
      local_1d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
      std::operator<<((ostream *)(local_1d0 + 8),
                      "Drawing texture to single sample framebuffer. Using sampler shader.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_1d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
      std::operator<<((ostream *)(local_1d0 + 8),
                      "Using sampler shader to sample the multisample texture to single sample framebuffer."
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1d0 + 8));
    if (iVar3 == -1) {
      pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1d0,"Location u_sampler was -1.",(allocator<char> *)local_280);
      tcu::TestError::TestError(pTVar13,(string *)local_1d0);
      __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar8 + 0x1c0))(0,0,0,0x3f800000);
    (**(code **)(lVar8 + 0x188))(0x4000);
    (**(code **)(lVar8 + 0x1a00))(0,0,this->m_renderSize);
    dVar4 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar4,"clear",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x23f);
    (**(code **)(lVar8 + 0xd8))(this->m_resolveVao);
    (**(code **)(lVar8 + 0x40))(0x8892,this->m_resolveBuffer);
    (**(code **)(lVar8 + 0x19f0))(uVar6,4,0x1406,0,0,0);
    (**(code **)(lVar8 + 0x610))(uVar6);
    dVar4 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar4,"set attrib",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x245);
    (**(code **)(lVar8 + 8))(0x84c0);
    (**(code **)(lVar8 + 0xb8))(uVar15,this->m_fboTexture);
    dVar4 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar4,"bind tex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x249);
    (**(code **)(lVar8 + 0x1680))((this->m_textureSamplerProgram->m_program).m_program);
    (**(code **)(lVar8 + 0x14f0))(iVar3,0);
    (**(code **)(lVar8 + 0x78))(0x8d40,this->m_resolveFbo);
    (**(code **)(lVar8 + 0x538))(5,0,4);
    (**(code **)(lVar8 + 0x1680))(0);
    (**(code **)(lVar8 + 0xd8))(0);
    dVar4 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar4,"draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x253);
    local_1d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1d0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Reading pixels from single sample framebuffer.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_1d0,&resultImage);
    glu::readPixels(pRVar2,0,0,(PixelBufferAccess *)local_1d0);
    dVar4 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar4,"read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,600);
    (**(code **)(lVar8 + 0x78))(0x8d40,0);
    verifyResultImageAndSetResult(this,&resultImage);
  }
  else {
    if (RVar5 != TARGET_DEFAULT) goto LAB_012d2c54;
    tcu::Surface::Surface(&resultImage,this->m_renderSize,this->m_renderSize);
    local_1d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1d0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Reading pixels from default framebuffer.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_1d0,&resultImage);
    glu::readPixels(pRVar2,0,0,(PixelBufferAccess *)local_1d0);
    dVar4 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar4,"read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x20f);
    verifyResultImageAndSetResult(this,&resultImage);
  }
  tcu::Surface::~Surface(&resultImage);
LAB_012d2c54:
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  std::__cxx11::string::~string((string *)&sectionDescription);
  return;
}

Assistant:

void MultisampleRenderCase::drawOneIteration (void)
{
	const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();
	const std::string			sectionDescription	= (m_numIterations > 1) ? ("Iteration " + de::toString(m_iteration+1) + "/" + de::toString(m_numIterations) + ": " + getIterationDescription(m_iteration)) : ("Test");
	const tcu::ScopedLogSection	section				(m_testCtx.getLog(), "Iteration" + de::toString(m_iteration), sectionDescription);

	// Per iteration shader?
	if (m_perIterationShader)
	{
		delete m_program;
		m_program = DE_NULL;

		m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource(genVertexSource(m_numTargetSamples))
			<< glu::FragmentSource(genFragmentSource(m_numTargetSamples)));
		m_testCtx.getLog() << tcu::TestLog::Section("RenderShader", "Render shader") << *m_program << tcu::TestLog::EndSection;
		if (!m_program->isOk())
			throw tcu::TestError("could not build program");

	}

	// render
	{
		if (m_renderTarget == TARGET_TEXTURE || m_renderTarget == TARGET_RENDERBUFFER)
		{
			gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
			GLU_EXPECT_NO_ERROR(gl.getError(), "bind fbo");

			m_testCtx.getLog() << tcu::TestLog::Message << "Rendering " << m_renderSceneDescription << " with render shader to fbo." << tcu::TestLog::EndMessage;
		}
		else
			m_testCtx.getLog() << tcu::TestLog::Message << "Rendering " << m_renderSceneDescription << " with render shader to default framebuffer." << tcu::TestLog::EndMessage;

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.viewport(0, 0, m_renderSize, m_renderSize);
		GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

		gl.bindVertexArray(m_renderVao);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_buffer);

		// set attribs
		DE_ASSERT(!m_renderAttribs.empty());
		for (std::map<std::string, Attrib>::const_iterator it = m_renderAttribs.begin(); it != m_renderAttribs.end(); ++it)
		{
			const deInt32 location = gl.getAttribLocation(m_program->getProgram(), it->first.c_str());

			if (location != -1)
			{
				gl.vertexAttribPointer(location, 4, GL_FLOAT, GL_FALSE, it->second.stride, (deUint8*)DE_NULL + it->second.offset);
				gl.enableVertexAttribArray(location);
			}
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "set attrib");

		gl.useProgram(m_program->getProgram());
		preDraw();
		gl.drawArrays(m_renderMode, 0, m_renderCount);
		postDraw();
		gl.useProgram(0);
		gl.bindVertexArray(0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "draw");

		if (m_renderTarget == TARGET_TEXTURE || m_renderTarget == TARGET_RENDERBUFFER)
			gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	}

	// read
	{
		if (m_renderTarget == TARGET_DEFAULT)
		{
			tcu::Surface resultImage(m_renderSize, m_renderSize);

			m_testCtx.getLog() << tcu::TestLog::Message << "Reading pixels from default framebuffer." << tcu::TestLog::EndMessage;

			// default directly
			glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "read pixels");

			// set test result
			verifyResultImageAndSetResult(resultImage);
		}
		else if (m_renderTarget == TARGET_RENDERBUFFER)
		{
			tcu::Surface resultImage(m_renderSize, m_renderSize);

			// rbo by blitting to non-multisample fbo

			m_testCtx.getLog() << tcu::TestLog::Message << "Blitting result from fbo to single sample fbo. (Resolve multisample)" << tcu::TestLog::EndMessage;

			gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo);
			gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_resolveFbo);
			gl.blitFramebuffer(0, 0, m_renderSize, m_renderSize, 0, 0, m_renderSize, m_renderSize, GL_COLOR_BUFFER_BIT, GL_NEAREST);
			GLU_EXPECT_NO_ERROR(gl.getError(), "blit resolve");

			m_testCtx.getLog() << tcu::TestLog::Message << "Reading pixels from single sample framebuffer." << tcu::TestLog::EndMessage;

			gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_resolveFbo);
			glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "read pixels");

			gl.bindFramebuffer(GL_FRAMEBUFFER, 0);

			// set test result
			verifyResultImageAndSetResult(resultImage);
		}
		else if (m_renderTarget == TARGET_TEXTURE && !m_verifyTextureSampleBuffers)
		{
			const deInt32	posLocation		= gl.getAttribLocation(m_textureSamplerProgram->getProgram(), "a_position");
			const deInt32	samplerLocation	= gl.getUniformLocation(m_textureSamplerProgram->getProgram(), "u_sampler");
			const deUint32	textureTarget	= (m_numRequestedSamples == 0) ? (GL_TEXTURE_2D) : (GL_TEXTURE_2D_MULTISAMPLE);
			tcu::Surface	resultImage		(m_renderSize, m_renderSize);

			if (m_numRequestedSamples)
				m_testCtx.getLog() << tcu::TestLog::Message << "Using sampler shader to sample the multisample texture to single sample framebuffer." << tcu::TestLog::EndMessage;
			else
				m_testCtx.getLog() << tcu::TestLog::Message << "Drawing texture to single sample framebuffer. Using sampler shader." << tcu::TestLog::EndMessage;

			if (samplerLocation == -1)
				throw tcu::TestError("Location u_sampler was -1.");

			// resolve multisample texture by averaging
			gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
			gl.clear(GL_COLOR_BUFFER_BIT);
			gl.viewport(0, 0, m_renderSize, m_renderSize);
			GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

			gl.bindVertexArray(m_resolveVao);
			gl.bindBuffer(GL_ARRAY_BUFFER, m_resolveBuffer);
			gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
			gl.enableVertexAttribArray(posLocation);
			GLU_EXPECT_NO_ERROR(gl.getError(), "set attrib");

			gl.activeTexture(GL_TEXTURE0);
			gl.bindTexture(textureTarget, m_fboTexture);
			GLU_EXPECT_NO_ERROR(gl.getError(), "bind tex");

			gl.useProgram(m_textureSamplerProgram->getProgram());
			gl.uniform1i(samplerLocation, 0);

			gl.bindFramebuffer(GL_FRAMEBUFFER, m_resolveFbo);
			gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);

			gl.useProgram(0);
			gl.bindVertexArray(0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "draw");

			m_testCtx.getLog() << tcu::TestLog::Message << "Reading pixels from single sample framebuffer." << tcu::TestLog::EndMessage;

			glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "read pixels");

			gl.bindFramebuffer(GL_FRAMEBUFFER, 0);

			// set test result
			verifyResultImageAndSetResult(resultImage);
		}
		else if (m_renderTarget == TARGET_TEXTURE && m_verifyTextureSampleBuffers)
		{
			const deInt32				posLocation		= gl.getAttribLocation(m_textureSamplerProgram->getProgram(), "a_position");
			const deInt32				samplerLocation	= gl.getUniformLocation(m_textureSamplerProgram->getProgram(), "u_sampler");
			const deInt32				sampleLocation	= gl.getUniformLocation(m_textureSamplerProgram->getProgram(), "u_sampleNdx");
			const deUint32				textureTarget	= (m_numRequestedSamples == 0) ? (GL_TEXTURE_2D) : (GL_TEXTURE_2D_MULTISAMPLE);
			std::vector<tcu::Surface>	resultBuffers	(m_numTargetSamples);

			if (m_numRequestedSamples)
				m_testCtx.getLog() << tcu::TestLog::Message << "Reading multisample texture sample buffers." << tcu::TestLog::EndMessage;
			else
				m_testCtx.getLog() << tcu::TestLog::Message << "Reading texture." << tcu::TestLog::EndMessage;

			if (samplerLocation == -1)
				throw tcu::TestError("Location u_sampler was -1.");
			if (sampleLocation == -1)
				throw tcu::TestError("Location u_sampleNdx was -1.");

			for (int sampleNdx = 0; sampleNdx < m_numTargetSamples; ++sampleNdx)
				resultBuffers[sampleNdx].setSize(m_renderSize, m_renderSize);

			// read sample buffers to different surfaces
			gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
			gl.clear(GL_COLOR_BUFFER_BIT);
			gl.viewport(0, 0, m_renderSize, m_renderSize);
			GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

			gl.bindVertexArray(m_resolveVao);
			gl.bindBuffer(GL_ARRAY_BUFFER, m_resolveBuffer);
			gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
			gl.enableVertexAttribArray(posLocation);
			GLU_EXPECT_NO_ERROR(gl.getError(), "set attrib");

			gl.activeTexture(GL_TEXTURE0);
			gl.bindTexture(textureTarget, m_fboTexture);
			GLU_EXPECT_NO_ERROR(gl.getError(), "bind tex");

			gl.bindFramebuffer(GL_FRAMEBUFFER, m_resolveFbo);
			gl.useProgram(m_textureSamplerProgram->getProgram());
			gl.uniform1i(samplerLocation, 0);

			m_testCtx.getLog() << tcu::TestLog::Message << "Reading sample buffers" << tcu::TestLog::EndMessage;

			for (int sampleNdx = 0; sampleNdx < m_numTargetSamples; ++sampleNdx)
			{
				gl.uniform1i(sampleLocation, sampleNdx);
				gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
				GLU_EXPECT_NO_ERROR(gl.getError(), "draw");

				glu::readPixels(m_context.getRenderContext(), 0, 0, resultBuffers[sampleNdx].getAccess());
				GLU_EXPECT_NO_ERROR(gl.getError(), "read pixels");
			}

			gl.useProgram(0);
			gl.bindVertexArray(0);
			gl.bindFramebuffer(GL_FRAMEBUFFER, 0);

			// verify sample buffers
			verifyResultBuffersAndSetResult(resultBuffers);
		}
		else
			DE_ASSERT(false);
	}
}